

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFragmentOutputTests.cpp
# Opt level: O0

Vec4 __thiscall deqp::gles3::Functional::readVec4(Functional *this,float *ptr,int numComponents)

{
  undefined8 extraout_XMM0_Qa;
  ulong uVar1;
  Vec4 VVar2;
  float local_44;
  float local_3c;
  float local_34;
  int numComponents_local;
  float *ptr_local;
  
  if (numComponents < 2) {
    local_34 = 0.0;
  }
  else {
    local_34 = ptr[1];
  }
  if (numComponents < 3) {
    local_3c = 0.0;
  }
  else {
    local_3c = ptr[2];
  }
  if (numComponents < 4) {
    local_44 = 0.0;
  }
  else {
    local_44 = ptr[3];
  }
  uVar1 = (ulong)(uint)local_34;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)this,*ptr,local_34,local_3c,local_44);
  VVar2.m_data[2] = (float)(int)uVar1;
  VVar2.m_data[3] = (float)(int)(uVar1 >> 0x20);
  VVar2.m_data[0] = (float)(int)extraout_XMM0_Qa;
  VVar2.m_data[1] = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return (Vec4)VVar2.m_data;
}

Assistant:

static inline Vec4 readVec4 (const float* ptr, int numComponents)
{
	DE_ASSERT(numComponents >= 1);
	return Vec4(ptr[0],
				numComponents >= 2 ? ptr[1] : 0.0f,
				numComponents >= 3 ? ptr[2] : 0.0f,
				numComponents >= 4 ? ptr[3] : 0.0f);
}